

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fct_standard_logger__on_fctx_end(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  fct_timer__stop((fct_timer_t *)(logger_ + 1));
  if (logger_[1].vtable.on_fctx_start == (_func_void_fct_logger_i_ptr_fct_logger_evt_t_ptr *)0x0) {
    pcVar3 = "PASSED";
  }
  else {
    fct_logger_print_failures((fct_nlist_t *)&logger_[1].vtable.on_test_suite_start);
    pcVar3 = "FAILED";
  }
  puts("\n----------------------------------------------------------------------------\n");
  sVar1 = fctkern__tst_cnt(e->kern);
  sVar2 = fctkern__tst_cnt_passed(e->kern);
  printf("%s (%lu/%lu tests",pcVar3,sVar2,sVar1);
  if (1e-07 < (double)logger_[1].vtable.on_test_end) {
    printf(" in %.6fs)\n");
    return;
  }
  puts(")\n");
  return;
}

Assistant:

static void
fct_standard_logger__on_fctx_end(
    fct_logger_i *logger_,
    fct_logger_evt_t const *e
)
{
    fct_standard_logger_t *logger = (fct_standard_logger_t*)logger_;
    nbool_t is_success =1;
    double elasped_time =0;
    size_t num_tests =0;
    size_t num_passed =0;

    fct_timer__stop(&(logger->timer));

    is_success = fct_nlist__size(&(logger->failed_cndtns_list)) ==0;

    if (  !is_success )
    {
        fct_logger_print_failures(&(logger->failed_cndtns_list));
    }
    puts(
        "\n----------------------------------------------------------------------------\n"
    );
    num_tests = fctkern__tst_cnt(e->kern);
    num_passed = fctkern__tst_cnt_passed(e->kern);
    printf(
        "%s (%lu/%lu tests",
        (is_success) ? "PASSED" : "FAILED",
        (unsigned long) num_passed,
        (unsigned long) num_tests
    );
    elasped_time = fct_timer__duration(&(logger->timer));
    if ( elasped_time > 0.0000001 )
    {
        printf(" in %.6fs)\n", elasped_time);
    }
    else
    {
        /* Don't bother displaying the time to execute. */
        puts(")\n");
    }
}